

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

bool __thiscall FlatZinc::AST::Node::hasAtom(Node *this,string *id)

{
  long lVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = __dynamic_cast(this,&typeinfo,&Array::typeinfo,0);
  if (lVar4 == 0) {
    lVar4 = __dynamic_cast(this,&typeinfo,&Atom::typeinfo,0);
    if (lVar4 == 0) {
      return false;
    }
    sVar2 = *(size_t *)(lVar4 + 0x10);
    if (sVar2 == id->_M_string_length) {
      if (sVar2 != 0) {
        iVar3 = bcmp(*(void **)(lVar4 + 8),(id->_M_dataplus)._M_p,sVar2);
        return iVar3 == 0;
      }
      return true;
    }
  }
  else {
    lVar1 = *(long *)(lVar4 + 8);
    lVar4 = *(long *)(lVar4 + 0x10) - lVar1;
    if (lVar4 != 0) {
      lVar4 = lVar4 >> 3;
      __s2 = (id->_M_dataplus)._M_p;
      sVar2 = id->_M_string_length;
      do {
        lVar5 = *(long *)(lVar1 + -8 + lVar4 * 8);
        if (lVar5 == 0) {
          lVar5 = 0;
        }
        else {
          lVar5 = __dynamic_cast(lVar5,&typeinfo,&Atom::typeinfo,0);
        }
        if ((lVar5 != 0) && (__n = *(size_t *)(lVar5 + 0x10), __n == sVar2)) {
          if (__n == 0) {
            return true;
          }
          iVar3 = bcmp(*(void **)(lVar5 + 8),__s2,__n);
          if (iVar3 == 0) {
            return true;
          }
        }
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
  }
  return false;
}

Assistant:

inline bool Node::hasAtom(const std::string& id) {
	if (auto* a = dynamic_cast<Array*>(this)) {
		for (auto i = a->a.size(); (i--) != 0;) {
			if (Atom* at = dynamic_cast<Atom*>(a->a[i])) {
				if (at->id == id) {
					return true;
				}
			}
		}
	} else if (Atom* a = dynamic_cast<Atom*>(this)) {
		return a->id == id;
	}
	return false;
}